

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall tetgenmesh::getedge(tetgenmesh *this,point e1,point e2,triface *tedge)

{
  arraypool *this_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  point pdVar4;
  arraypool *tetlist;
  uint local_68;
  int j;
  int i;
  int done;
  point pt;
  triface *parytet;
  triface neightet;
  triface searchtet;
  triface *tedge_local;
  point e2_local;
  point e1_local;
  tetgenmesh *this_local;
  
  triface::triface((triface *)&neightet.ver);
  triface::triface((triface *)&parytet);
  if (2 < this->b->verbose) {
    uVar2 = pointmark(this,e1);
    uVar3 = pointmark(this,e2);
    printf("      Get edge from %d to %d.\n",(ulong)uVar2,(ulong)uVar3);
  }
  bVar1 = isdeadtet(this,tedge);
  if (!bVar1) {
    pdVar4 = org(this,tedge);
    if (pdVar4 == e1) {
      pdVar4 = dest(this,tedge);
      if (pdVar4 == e2) {
        return 1;
      }
    }
    else {
      pdVar4 = org(this,tedge);
      if ((pdVar4 == e2) && (pdVar4 = dest(this,tedge), pdVar4 == e1)) {
        esymself(this,tedge);
        return 1;
      }
    }
  }
  point2tetorg(this,e1,tedge);
  finddirection(this,tedge,e2);
  pdVar4 = dest(this,tedge);
  if (pdVar4 == e2) {
    this_local._4_4_ = 1;
  }
  else {
    point2tetorg(this,e2,tedge);
    finddirection(this,tedge,e1);
    pdVar4 = dest(this,tedge);
    if (pdVar4 == e1) {
      esymself(this,tedge);
      this_local._4_4_ = 1;
    }
    else {
      point2tetorg(this,e1,(triface *)&neightet.ver);
      enextesymself(this,(triface *)&neightet.ver);
      this_00 = this->cavebdrylist;
      for (local_68 = 0; (int)local_68 < 3; local_68 = local_68 + 1) {
        pdVar4 = apex(this,(triface *)&neightet.ver);
        if (pdVar4 == e2) {
          eorgoppo(this,(triface *)&neightet.ver,tedge);
          return 1;
        }
        enextself(this,(triface *)&neightet.ver);
      }
      fnext(this,(triface *)&neightet.ver,(triface *)&parytet);
      esymself(this,(triface *)&parytet);
      pdVar4 = apex(this,(triface *)&parytet);
      if (pdVar4 == e2) {
        eorgoppo(this,(triface *)&parytet,tedge);
        this_local._4_4_ = 1;
      }
      else {
        infect(this,(triface *)&neightet.ver);
        arraypool::newindex(this_00,&pt);
        triface::operator=((triface *)pt,(triface *)&neightet.ver);
        infect(this,(triface *)&parytet);
        arraypool::newindex(this_00,&pt);
        triface::operator=((triface *)pt,(triface *)&parytet);
        j = 0;
        for (local_68 = 0; (long)(int)local_68 < this_00->objects && j == 0; local_68 = local_68 + 1
            ) {
          pt = (point)(this_00->toparray
                       [(int)local_68 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                      (int)((local_68 & this_00->objectsperblockmark) * this_00->objectbytes));
          triface::operator=((triface *)&neightet.ver,(triface *)pt);
          for (tetlist._4_4_ = 0; tetlist._4_4_ < 2 && j == 0; tetlist._4_4_ = tetlist._4_4_ + 1) {
            enextself(this,(triface *)&neightet.ver);
            fnext(this,(triface *)&neightet.ver,(triface *)&parytet);
            bVar1 = infected(this,(triface *)&parytet);
            if (!bVar1) {
              esymself(this,(triface *)&parytet);
              pdVar4 = apex(this,(triface *)&parytet);
              if (pdVar4 == e2) {
                eorgoppo(this,(triface *)&parytet,tedge);
                j = 1;
              }
              else {
                infect(this,(triface *)&parytet);
                arraypool::newindex(this_00,&pt);
                triface::operator=((triface *)pt,(triface *)&parytet);
              }
            }
          }
        }
        for (local_68 = 0; (long)(int)local_68 < this_00->objects; local_68 = local_68 + 1) {
          pt = (point)(this_00->toparray
                       [(int)local_68 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                      (int)((local_68 & this_00->objectsperblockmark) * this_00->objectbytes));
          uninfect(this,(triface *)pt);
        }
        arraypool::restart(this_00);
        this_local._4_4_ = j;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::getedge(point e1, point e2, triface *tedge)
{
  triface searchtet, neightet, *parytet;
  point pt;
  int done;
  int i, j;

  if (b->verbose > 2) {
    printf("      Get edge from %d to %d.\n", pointmark(e1), pointmark(e2));
  }

  // Quickly check if 'tedge' is just this edge.
  if (!isdeadtet(*tedge)) {
    if (org(*tedge) == e1) {
      if (dest(*tedge) == e2) {
        return 1;
      }
    } else if (org(*tedge) == e2) {
      if (dest(*tedge) == e1) {
        esymself(*tedge);
        return 1;
      }
    }
  }

  // Search for the edge [e1, e2].
  point2tetorg(e1, *tedge);
  finddirection(tedge, e2);
  if (dest(*tedge) == e2) {
    return 1;
  } else {
    // Search for the edge [e2, e1].
    point2tetorg(e2, *tedge);
    finddirection(tedge, e1);
    if (dest(*tedge) == e1) {
      esymself(*tedge);
      return 1;
    }
  }


  // Go to the link face of e1.
  point2tetorg(e1, searchtet);
  enextesymself(searchtet);
  arraypool *tetlist = cavebdrylist;

  // Search e2.
  for (i = 0; i < 3; i++) {
    pt = apex(searchtet);
    if (pt == e2) {
      // Found. 'searchtet' is [#,#,e2,e1].
      eorgoppo(searchtet, *tedge); // [e1,e2,#,#].
      return 1;
    }
    enextself(searchtet);
  }

  // Get the adjacent link face at 'searchtet'.
  fnext(searchtet, neightet);
  esymself(neightet);
  // assert(oppo(neightet) == e1);
  pt = apex(neightet);
  if (pt == e2) {
    // Found. 'neightet' is [#,#,e2,e1].
    eorgoppo(neightet, *tedge); // [e1,e2,#,#].
    return 1;
  }

  // Continue searching in the link face of e1.
  infect(searchtet);
  tetlist->newindex((void **) &parytet);
  *parytet = searchtet;
  infect(neightet);
  tetlist->newindex((void **) &parytet);
  *parytet = neightet;

  done = 0;

  for (i = 0; (i < tetlist->objects) && !done; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    searchtet = *parytet;
    for (j = 0; (j < 2) && !done; j++) {
      enextself(searchtet);
      fnext(searchtet, neightet);
      if (!infected(neightet)) {        
        esymself(neightet);
        pt = apex(neightet);
        if (pt == e2) {
          // Found. 'neightet' is [#,#,e2,e1].
          eorgoppo(neightet, *tedge);
          done = 1;
        } else {
          infect(neightet);
          tetlist->newindex((void **) &parytet);
          *parytet = neightet;
        }
      }
    } // j
  } // i 

  // Uninfect the list of visited tets.
  for (i = 0; i < tetlist->objects; i++) {
    parytet = (triface *) fastlookup(tetlist, i);
    uninfect(*parytet);
  }
  tetlist->restart();

  return done;
}